

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O1

WeightLitsRep *
Clasp::WeightLitsRep::create
          (WeightLitsRep *__return_storage_ptr__,Solver *s,WeightLitVec *lits,weight_t bound)

{
  pointer __dest;
  uint *puVar1;
  uint uVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  int iVar5;
  pair<Clasp::Literal,_int> *ppVar6;
  uint uVar7;
  ulong uVar8;
  pointer ppVar9;
  char *exp;
  ulong uVar10;
  ulong uVar11;
  size_type sVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  char *fmt;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  _Iter_comp_iter<Clasp::compose_2_2<std::greater<int>,_Clasp::select2nd<std::pair<Clasp::Literal,_int>_>,_Clasp::select2nd<std::pair<Clasp::Literal,_int>_>_>_>
  in_stack_ffffffffffffffa8;
  _Temporary_buffer<std::pair<Clasp::Literal,_int>_*,_std::pair<Clasp::Literal,_int>_> local_48;
  long lVar19;
  
  if (((s->assign_).assign_.ebo_.size - 1 < (s->shared_->varInfo_).ebo_.size - 1) &&
     (uVar8 = (ulong)(lits->ebo_).size, uVar8 != 0)) {
    ppVar9 = (lits->ebo_).buf;
    ppVar6 = std::__max_element<std::pair<Clasp::Literal,int>*,__gnu_cxx::__ops::_Iter_less_iter>
                       (ppVar9,ppVar9 + uVar8);
    Solver::acquireProblemVar(s,(ppVar6->first).rep_ >> 2);
  }
  uVar16 = 0;
  if ((lits->ebo_).size == 0) {
    sVar12 = 0;
  }
  else {
    sVar12 = 0;
    uVar13 = 0;
    do {
      ppVar9 = (lits->ebo_).buf;
      uVar15 = ppVar9[uVar13].first.rep_;
      iVar5 = ppVar9[uVar13].second;
      uVar7 = uVar15 & 0xfffffffe;
      ppVar9[uVar13].first.rep_ = uVar7;
      if ((iVar5 == 0) ||
         (puVar3 = (s->assign_).assign_.ebo_.buf,
         uVar14 = *(uint *)((long)puVar3 + (ulong)(uVar15 & 0xfffffffc)),
         uVar14 < 0x10 && (uVar14 & 3) != 0)) {
        if ((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar15 & 0xfffffffc)) & 3
                  ) != (byte)(2U - ((uVar15 & 2) == 0))) {
          iVar5 = 0;
        }
        bound = bound - iVar5;
      }
      else {
        if (iVar5 < 0) {
          ppVar9[uVar13].second = -iVar5;
          uVar7 = uVar7 ^ 2;
          ppVar9[uVar13].first.rep_ = uVar7;
          if ((-1 < bound) &&
             (SBORROW4(bound ^ 0x7fffffffU,-iVar5) != (int)((bound ^ 0x7fffffffU) + iVar5) < 0)) {
            exp = "bound < 0 || (MAX_W-bound) >= lits[i].second";
            fmt = "bound out of range";
            iVar5 = -2;
            uVar16 = 0x38;
            goto LAB_0017a45f;
          }
          bound = bound - iVar5;
        }
        uVar8 = (ulong)sVar12;
        uVar15 = uVar7 >> 2;
        if ((*(byte *)((long)puVar3 + (ulong)(uVar7 & 0xfffffffc)) & 0xc) == 0) {
          if (uVar13 != sVar12) {
            ppVar9[uVar8] = ppVar9[uVar13];
          }
          puVar3[uVar15] = puVar3[uVar15] | (uVar7 & 2) * 2 + 4;
          sVar12 = sVar12 + 1;
        }
        else if ((*(uint *)((long)puVar3 + (ulong)(uVar7 & 0xfffffffc)) &
                 (uint)((uVar7 & 2) == 0) * 4 + 4) == 0) {
          if (sVar12 == 0) {
            uVar8 = 0;
          }
          else {
            uVar11 = 0;
            do {
              if ((ppVar9[uVar11].first.rep_ ^ uVar7) < 2) {
                uVar8 = uVar11 & 0xffffffff;
                break;
              }
              uVar11 = uVar11 + 1;
            } while (sVar12 != (uint)uVar11);
          }
          ppVar9[uVar8].second = ppVar9[uVar8].second + ppVar9[uVar13].second;
        }
        else {
          uVar10 = 0;
          uVar11 = uVar10;
          if (sVar12 != 0) {
            do {
              uVar11 = uVar10;
              if ((ppVar9[uVar10].first.rep_ ^ uVar7 ^ 2) < 2) break;
              uVar10 = uVar10 + 1;
              uVar11 = uVar8;
            } while (uVar8 != uVar10);
          }
          bound = bound - ppVar9[uVar13].second;
          __dest = ppVar9 + (uVar11 & 0xffffffff);
          iVar5 = __dest->second - ppVar9[uVar13].second;
          __dest->second = iVar5;
          if (iVar5 < 0) {
            (__dest->first).rep_ = uVar7;
            __dest->second = -iVar5;
            puVar3[uVar15] = (puVar3[uVar15] & 0xfffffff3) + (uVar7 & 2) * 2 + 4;
            bound = bound + __dest->second;
          }
          else if (iVar5 == 0) {
            *(byte *)(puVar3 + uVar15) = (byte)puVar3[uVar15] & 0xf3;
            memmove(__dest,__dest + 1,(ulong)(~(uint)uVar11 + sVar12) << 3);
            sVar12 = sVar12 - 1;
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (lits->ebo_).size);
  }
  ppVar6 = (lits->ebo_).buf;
  (lits->ebo_).size = sVar12;
  uVar13 = 1;
  uVar15 = 1;
  if (1 < bound) {
    uVar15 = bound;
  }
  if (sVar12 == 0) {
    uVar7 = 0x7fffffff;
    sVar12 = 0;
  }
  else {
    puVar3 = (s->assign_).assign_.ebo_.buf;
    uVar7 = 0x7fffffff;
    uVar14 = 0;
    uVar16 = 0;
    do {
      puVar1 = (uint *)((long)puVar3 + (ulong)(ppVar6[uVar14].first.rep_ & 0xfffffffc));
      *puVar1 = *puVar1 & 0xfffffff3;
      uVar2 = ppVar6[uVar14].second;
      if ((int)uVar13 < (int)uVar2) {
        uVar13 = uVar2;
        if ((int)uVar15 < (int)uVar2) {
          uVar13 = uVar15;
        }
        ppVar6[uVar14].second = uVar13;
      }
      uVar2 = ppVar6[uVar14].second;
      if ((int)(uVar16 ^ 0x7fffffff) < (int)uVar2) {
        exp = "(MAX_W - sumW) >= lits[i].second";
        fmt = "Sum of weights out of range";
        iVar5 = 0x4b;
        uVar16 = 0x62;
LAB_0017a45f:
        Potassco::fail(iVar5,
                       "static WeightLitsRep Clasp::WeightLitsRep::create(Solver &, WeightLitVec &, weight_t)"
                       ,uVar16,exp,fmt,0);
      }
      if ((int)uVar2 < (int)uVar7) {
        uVar7 = uVar2;
      }
      uVar16 = uVar16 + uVar2;
      uVar14 = uVar14 + 1;
      sVar12 = (lits->ebo_).size;
    } while (uVar14 != sVar12);
  }
  auVar4 = _DAT_001ad1c0;
  if (uVar13 == uVar7) {
    if (uVar7 != 1) {
      bound = (int)(uVar7 + bound + -1) / (int)uVar7;
      uVar16 = (int)(uVar7 + uVar16 + -1) / (int)uVar7;
      if (sVar12 != 0) {
        lVar19 = (ulong)sVar12 - 1;
        auVar17._8_4_ = (int)lVar19;
        auVar17._0_8_ = lVar19;
        auVar17._12_4_ = (int)((ulong)lVar19 >> 0x20);
        uVar8 = 0;
        auVar17 = auVar17 ^ _DAT_001ad1c0;
        auVar18 = _DAT_001ad1a0;
        auVar20 = _DAT_001ad1b0;
        do {
          auVar21 = auVar20 ^ auVar4;
          iVar5 = auVar17._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar5 && auVar17._0_4_ < auVar21._0_4_ ||
                      iVar5 < auVar21._4_4_) & 1)) {
            *(undefined4 *)((long)&ppVar6->second + uVar8) = 1;
          }
          if ((auVar21._12_4_ != auVar17._12_4_ || auVar21._8_4_ <= auVar17._8_4_) &&
              auVar21._12_4_ <= auVar17._12_4_) {
            *(undefined4 *)((long)&ppVar6[1].second + uVar8) = 1;
          }
          auVar21 = auVar18 ^ auVar4;
          iVar22 = auVar21._4_4_;
          if (iVar22 <= iVar5 && (iVar22 != iVar5 || auVar21._0_4_ <= auVar17._0_4_)) {
            *(undefined4 *)((long)&ppVar6[2].second + uVar8) = 1;
            *(undefined4 *)((long)&ppVar6[3].second + uVar8) = 1;
          }
          lVar19 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar19 + 4;
          lVar19 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 4;
          auVar18._8_8_ = lVar19 + 4;
          uVar8 = uVar8 + 0x20;
        } while (((ulong)sVar12 * 8 + 0x18 & 0xffffffffffffffe0) != uVar8);
      }
    }
  }
  else if (sVar12 != 0) {
    std::_Temporary_buffer<std::pair<Clasp::Literal,_int>_*,_std::pair<Clasp::Literal,_int>_>::
    _Temporary_buffer(&local_48,ppVar6,(ulong)sVar12 + 1 >> 1);
    if (local_48._M_buffer == (pair<Clasp::Literal,_int> *)0x0) {
      std::
      __inplace_stable_sort<std::pair<Clasp::Literal,int>*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::compose_2_2<std::greater<int>,Clasp::select2nd<std::pair<Clasp::Literal,int>>,Clasp::select2nd<std::pair<Clasp::Literal,int>>>>>
                (ppVar6,ppVar6 + sVar12,in_stack_ffffffffffffffa8);
    }
    else {
      std::
      __stable_sort_adaptive<std::pair<Clasp::Literal,int>*,std::pair<Clasp::Literal,int>*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::compose_2_2<std::greater<int>,Clasp::select2nd<std::pair<Clasp::Literal,int>>,Clasp::select2nd<std::pair<Clasp::Literal,int>>>>>
                (ppVar6,ppVar6 + sVar12,local_48._M_buffer,local_48._M_len,in_stack_ffffffffffffffa8
                );
    }
    operator_delete(local_48._M_buffer);
  }
  sVar12 = (lits->ebo_).size;
  if (sVar12 == 0) {
    ppVar9 = (pointer)0x0;
  }
  else {
    ppVar9 = (lits->ebo_).buf;
  }
  __return_storage_ptr__->lits = ppVar9;
  __return_storage_ptr__->size = sVar12;
  __return_storage_ptr__->bound = bound;
  __return_storage_ptr__->reach = uVar16;
  return __return_storage_ptr__;
}

Assistant:

WeightLitsRep WeightLitsRep::create(Solver& s, WeightLitVec& lits, weight_t bound) {
	// Step 0: Ensure s has all relevant problem variables
	if (s.numProblemVars() > s.numVars() && !lits.empty()) {
		s.acquireProblemVar(std::max_element(lits.begin(), lits.end())->first.var());
	}
	// Step 1: remove assigned/superfluous literals and merge duplicate/complementary ones
	LitVec::size_type j = 0, other;
	const weight_t MAX_W= std::numeric_limits<weight_t>::max();
	for (LitVec::size_type i = 0; i != lits.size(); ++i) {
		Literal x = lits[i].first.unflag();
		if (lits[i].second != 0 && s.topValue(x.var()) == value_free) {
			if (lits[i].second < 0) {
				lits[i].second = -lits[i].second;
				lits[i].first  = x = ~lits[i].first;
				POTASSCO_REQUIRE(bound < 0 || (MAX_W-bound) >= lits[i].second, "bound out of range");
				bound         += lits[i].second;
			}
			if (!s.seen(x.var())) { // first time we see x, keep and mark x
				if (i != j) lits[j] = lits[i];
				s.markSeen(x);
				++j;
			}
			else if (!s.seen(~x)) { // multi-occurrences of x, merge
				for (other = 0; other != j && lits[other].first != x; ++other) { ; }
				lits[other].second += lits[i].second;
			}
			else {                  // complementary literals ~x x
				for (other = 0; other != j && lits[other].first != ~x; ++other) { ; }
				bound              -= lits[i].second; // decrease by min(w(~x), w(x)) ; assume w(~x) > w(x)
				lits[other].second -= lits[i].second; // keep ~x,
				if (lits[other].second < 0) {         // actually, w(x) > w(~x),
					lits[other].first  = x;             // replace ~x with x
					lits[other].second = -lits[other].second;
					s.clearSeen(x.var());
					s.markSeen(x);
					bound += lits[other].second;        // and correct the bound
				}
				else if (lits[other].second == 0) {   // w(~x) == w(x) - drop both lits
					s.clearSeen(x.var());
					std::memmove(&lits[0]+other, &lits[0]+other+1, (j-other-1)*sizeof(lits[other]));
					--j;
				}
			}
		}
		else if (s.isTrue(x)) { bound -= lits[i].second; }
	}
	lits.erase(lits.begin()+j, lits.end());
	// Step 2: compute min,max, achievable weight and clear flags set in step 1
	weight_t sumW = 0;
	weight_t minW = MAX_W, maxW = 1;
	weight_t B    = std::max(bound, 1);
	for (LitVec::size_type i = 0; i != lits.size(); ++i) {
		assert(lits[i].second > 0);
		s.clearSeen(lits[i].first.var());
		if (lits[i].second > maxW) { maxW = lits[i].second = std::min(lits[i].second, B);  }
		if (lits[i].second < minW) { minW = lits[i].second; }
		POTASSCO_CHECK((MAX_W - sumW) >= lits[i].second, EOVERFLOW, "Sum of weights out of range");
		sumW += lits[i].second;
	}
	// Step 3: sort by decreasing weight
	if (maxW != minW) {
		std::stable_sort(lits.begin(), lits.end(), compose22(
			std::greater<weight_t>(),
			select2nd<WeightLiteral>(),
			select2nd<WeightLiteral>()));
	}
	else if (minW != 1) {
		// disguised cardinality constraint
		bound = (bound+(minW-1))/minW;
		sumW  = (sumW+(minW-1))/minW;
		for (LitVec::size_type i = 0; i != lits.size(); ++i) { lits[i].second = 1; }
	}
	WeightLitsRep result = { !lits.empty() ? &lits[0] : 0, (uint32)lits.size(), bound, sumW };
	return result;
}